

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::iterate
          (EarlyFragmentTestsCase *this)

{
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data_01;
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  deBool dVar4;
  GLenum GVar5;
  GLSLVersion version;
  Functional *this_00;
  TestLog *log_00;
  Functions *pFVar6;
  char *pcVar7;
  RenderTarget *pRVar8;
  MessageBuilder *pMVar9;
  long lVar10;
  MovePtr *pMVar11;
  ObjectWrapper *pOVar12;
  TestError *this_01;
  ProgramSources *pPVar13;
  RenderContext *renderContext;
  bool bVar14;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffff52c;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffff534;
  int local_a80;
  VertexArrayBinding *local_a38;
  GLint local_8d0;
  GLint local_8c0;
  R32UIImageSingleValueVerifier local_898;
  Vector<int,_3> local_884;
  TextureFormat local_878;
  deUint32 local_870;
  deUint32 local_86c;
  int expectedMax;
  int expectedMin;
  int tolerance;
  int expectedCounter;
  int numSamples;
  allocator<char> local_831;
  string local_830;
  LogImage local_810;
  PixelBufferAccess local_780;
  undefined1 local_758 [8];
  Surface rendered;
  allocator<char> local_721;
  string local_720;
  undefined1 *local_700;
  undefined1 local_6f8 [8];
  VertexArrayBinding attrBindings [1];
  undefined1 local_6a0 [8];
  UniformAccessLogger uniforms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  ShaderSource local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  ShaderSource local_528;
  ProgramSources local_500;
  undefined1 local_430 [8];
  ShaderProgram program;
  undefined1 local_358 [8];
  string glslVersionDeclaration;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  local_330;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *local_320;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_> local_309;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  local_308;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *local_2f8;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_2e1;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_2e0;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_2d0;
  Vector<int,_4> local_2c0;
  TextureFormat local_2b0;
  undefined1 local_2a8 [8];
  LayeredImage src;
  MessageBuilder local_238;
  undefined1 local_b8 [8];
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  testAttachment;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  colorAttachment;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  fbo;
  Texture texture;
  int viewportY;
  int viewportX;
  int viewportHeight;
  int viewportWidth;
  bool expectPartialResult;
  undefined1 local_50 [8];
  Random rnd;
  CallLogWrapper glLog;
  TestLog *log;
  RenderContext *renderCtx;
  EarlyFragmentTestsCase *this_local;
  
  this_00 = (Functional *)gles31::Context::getRenderContext((this->super_TestCase).m_context);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pFVar6 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  glu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)&rnd.m_rnd.z,pFVar6,log_00);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar7);
  de::Random::Random((Random *)local_50,dVar2);
  bVar14 = false;
  if ((this->m_useEarlyTests & 1U) != 0) {
    bVar14 = this->m_renderTarget != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT;
  }
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar8 = (RenderTarget *)(**(code **)(*(long *)this_00 + 0x20))();
    iVar3 = tcu::RenderTarget::getWidth(pRVar8);
    local_8c0 = de::Random::getInt((Random *)local_50,0,iVar3 + -0x20);
  }
  else {
    local_8c0 = 0;
  }
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar8 = (RenderTarget *)(**(code **)(*(long *)this_00 + 0x20))();
    iVar3 = tcu::RenderTarget::getHeight(pRVar8);
    local_8d0 = de::Random::getInt((Random *)local_50,0,iVar3 + -0x20);
  }
  else {
    local_8d0 = 0;
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &fbo.
              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              .m_data.field_0x8,(RenderContext *)this_00);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)&colorAttachment.
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)&testAttachment.
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)local_b8);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&rnd.m_rnd.z,true);
  tcu::TestLog::operator<<(&local_238,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [28])"// Created a texture (name ");
  src.m_tex2DArray.m_state._4_4_ =
       glu::ObjectWrapper::operator*
                 ((ObjectWrapper *)
                  &fbo.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   .m_data.field_0x8);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(uint *)((long)&src.m_tex2DArray.m_state + 4));
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a94734);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)&rnd.m_rnd.z,0x84c0);
  dVar2 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &fbo.
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.field_0x8);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)&rnd.m_rnd.z,0xde1,dVar2);
  setTexParameteri((CallLogWrapper *)&rnd.m_rnd.z,0xde1);
  tcu::TextureFormat::TextureFormat(&local_2b0,R,UNSIGNED_INT32);
  LayeredImage::LayeredImage((LayeredImage *)local_2a8,TEXTURETYPE_2D,&local_2b0,1,1,1);
  tcu::Vector<int,_4>::Vector(&local_2c0,0);
  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
            ((LayeredImage *)local_2a8,0,0,0,&local_2c0);
  uploadTexture((CallLogWrapper *)&rnd.m_rnd.z,(LayeredImage *)local_2a8,0);
  LayeredImage::~LayeredImage((LayeredImage *)local_2a8);
  dVar2 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &fbo.
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.field_0x8);
  uVar16 = 0x8236;
  uVar15 = 0x88ba;
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)&rnd.m_rnd.z,0,dVar2,0,'\x01',0,0x88ba,0x8236);
  lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
  dVar2 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar2,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xba3);
  if ((this->m_renderTarget == RENDERTARGET_FBO) ||
     (this->m_renderTarget == RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT)) {
    pMVar11 = (MovePtr *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)3> *)pMVar11,(RenderContext *)this_00);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_2e1);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               *)&local_2e0);
    local_2d0 = de::details::MovePtr::operator_cast_to_PtrData(&local_2e0,pMVar11);
    data.ptr._4_4_ = in_stack_fffffffffffff52c;
    data.ptr._0_4_ = uVar15;
    data._8_4_ = uVar16;
    data._12_4_ = in_stack_fffffffffffff534;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::operator=((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 *)&colorAttachment.
                    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                    .m_data.field_0x8,data);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                *)&local_2e0);
    pMVar11 = (MovePtr *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)2> *)pMVar11,(RenderContext *)this_00);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>::DefaultDeleter(&local_309);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               *)&local_308);
    local_2f8 = de::details::MovePtr::operator_cast_to_PtrData(&local_308,pMVar11);
    data_00.ptr._4_4_ = in_stack_fffffffffffff52c;
    data_00.ptr._0_4_ = uVar15;
    data_00._8_4_ = uVar16;
    data_00._12_4_ = in_stack_fffffffffffff534;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::operator=((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 *)&testAttachment.
                    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                    .m_data.field_0x8,data_00);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                *)&local_308);
    pMVar11 = (MovePtr *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)2> *)pMVar11,(RenderContext *)this_00);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>::DefaultDeleter
              ((DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_> *)
               (glslVersionDeclaration.field_2._M_local_buf + 0xf));
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               *)&local_330);
    local_320 = de::details::MovePtr::operator_cast_to_PtrData(&local_330,pMVar11);
    data_01.ptr._4_4_ = in_stack_fffffffffffff52c;
    data_01.ptr._0_4_ = uVar15;
    data_01._8_4_ = uVar16;
    data_01._12_4_ = in_stack_fffffffffffff534;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::operator=((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 *)local_b8,data_01);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                *)&local_330);
    pOVar12 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                            *)&testAttachment.
                               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                               .m_data.field_0x8)->super_ObjectWrapper;
    dVar2 = glu::ObjectWrapper::operator*(pOVar12);
    glu::CallLogWrapper::glBindRenderbuffer((CallLogWrapper *)&rnd.m_rnd.z,0x8d41,dVar2);
    glu::CallLogWrapper::glRenderbufferStorage
              ((CallLogWrapper *)&rnd.m_rnd.z,0x8d41,0x8058,0x20,0x20);
    lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar2 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar2,"gen color attachment rb",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbaf);
    pOVar12 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                            *)&colorAttachment.
                               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                               .m_data.field_0x8)->super_ObjectWrapper;
    dVar2 = glu::ObjectWrapper::operator*(pOVar12);
    glu::CallLogWrapper::glBindFramebuffer((CallLogWrapper *)&rnd.m_rnd.z,0x8d40,dVar2);
    pOVar12 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                            *)&testAttachment.
                               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                               .m_data.field_0x8)->super_ObjectWrapper;
    dVar2 = glu::ObjectWrapper::operator*(pOVar12);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              ((CallLogWrapper *)&rnd.m_rnd.z,0x8d40,0x8ce0,0x8d41,dVar2);
    lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar2 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar2,"set fbo color attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbb3);
    if ((this->m_renderTarget == RENDERTARGET_FBO) && (this->m_type == TESTTYPE_DEPTH)) {
      pOVar12 = &de::details::
                 UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                              *)local_b8)->super_ObjectWrapper;
      dVar2 = glu::ObjectWrapper::operator*(pOVar12);
      glu::CallLogWrapper::glBindRenderbuffer((CallLogWrapper *)&rnd.m_rnd.z,0x8d41,dVar2);
      glu::CallLogWrapper::glRenderbufferStorage
                ((CallLogWrapper *)&rnd.m_rnd.z,0x8d41,0x81a5,0x20,0x20);
      lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
      dVar2 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar2,"gen depth attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbb9);
      pOVar12 = &de::details::
                 UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                              *)local_b8)->super_ObjectWrapper;
      dVar2 = glu::ObjectWrapper::operator*(pOVar12);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                ((CallLogWrapper *)&rnd.m_rnd.z,0x8d40,0x8d00,0x8d41,dVar2);
      lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
      dVar2 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar2,"set fbo depth attachment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbbc);
    }
    else if ((this->m_renderTarget == RENDERTARGET_FBO) && (this->m_type == TESTTYPE_STENCIL)) {
      pOVar12 = &de::details::
                 UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                              *)local_b8)->super_ObjectWrapper;
      dVar2 = glu::ObjectWrapper::operator*(pOVar12);
      glu::CallLogWrapper::glBindRenderbuffer((CallLogWrapper *)&rnd.m_rnd.z,0x8d41,dVar2);
      glu::CallLogWrapper::glRenderbufferStorage
                ((CallLogWrapper *)&rnd.m_rnd.z,0x8d41,0x8d48,0x20,0x20);
      lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
      dVar2 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar2,"gen stencil attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbc2);
      pOVar12 = &de::details::
                 UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                              *)local_b8)->super_ObjectWrapper;
      dVar2 = glu::ObjectWrapper::operator*(pOVar12);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                ((CallLogWrapper *)&rnd.m_rnd.z,0x8d40,0x8d20,0x8d41,dVar2);
      lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
      dVar2 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar2,"set fbo stencil attachment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbc5);
    }
    pOVar12 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                            *)&testAttachment.
                               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                               .m_data.field_0x8)->super_ObjectWrapper;
    dVar2 = glu::ObjectWrapper::operator*(pOVar12);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              ((CallLogWrapper *)&rnd.m_rnd.z,0x8d40,0x8ce0,0x8d41,dVar2);
    lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar2 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar2,"setup fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbc9);
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) ||
         (GVar5 = glu::CallLogWrapper::glCheckFramebufferStatus
                            ((CallLogWrapper *)&rnd.m_rnd.z,0x8d40), GVar5 != 0x8cd5)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,
                   "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                   ,0xbca);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  glu::CallLogWrapper::glClearColor((CallLogWrapper *)&rnd.m_rnd.z,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glClear((CallLogWrapper *)&rnd.m_rnd.z,0x4000);
  if (this->m_type == TESTTYPE_DEPTH) {
    glu::CallLogWrapper::glClearDepthf((CallLogWrapper *)&rnd.m_rnd.z,0.5);
    glu::CallLogWrapper::glClear((CallLogWrapper *)&rnd.m_rnd.z,0x100);
    glu::CallLogWrapper::glEnable((CallLogWrapper *)&rnd.m_rnd.z,0xb71);
  }
  else if (this->m_type == TESTTYPE_STENCIL) {
    glu::CallLogWrapper::glClearStencil((CallLogWrapper *)&rnd.m_rnd.z,0);
    glu::CallLogWrapper::glClear((CallLogWrapper *)&rnd.m_rnd.z,0x400);
    glu::CallLogWrapper::glScissor((CallLogWrapper *)&rnd.m_rnd.z,local_8c0,local_8d0,0x10,0x20);
    glu::CallLogWrapper::glEnable((CallLogWrapper *)&rnd.m_rnd.z,0xc11);
    glu::CallLogWrapper::glClearStencil((CallLogWrapper *)&rnd.m_rnd.z,1);
    glu::CallLogWrapper::glClear((CallLogWrapper *)&rnd.m_rnd.z,0x400);
    glu::CallLogWrapper::glDisable((CallLogWrapper *)&rnd.m_rnd.z,0xc11);
    glu::CallLogWrapper::glStencilFunc((CallLogWrapper *)&rnd.m_rnd.z,0x202,1,1);
    glu::CallLogWrapper::glStencilOp((CallLogWrapper *)&rnd.m_rnd.z,0x1e00,0x1e00,0x1e00);
    glu::CallLogWrapper::glEnable((CallLogWrapper *)&rnd.m_rnd.z,0xb90);
  }
  program.m_program.m_info.linkTimeUs._4_4_ = (**(code **)(*(long *)this_00 + 0x10))();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  pcVar7 = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_358,pcVar7,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_500);
  std::operator+(&local_548,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                 "\n\nhighp in vec3 a_position;\n\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n}\n"
                );
  glu::VertexSource::VertexSource((VertexSource *)&local_528,&local_548);
  pPVar13 = glu::ProgramSources::operator<<(&local_500,&local_528);
  std::operator+(&local_610,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,"\n"
                );
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_630,this_00,renderContext);
  std::operator+(&local_5f0,&local_610,&local_630);
  std::operator+(&local_5d0,&local_5f0,"\n");
  pcVar7 = "";
  if ((this->m_useEarlyTests & 1U) != 0) {
    pcVar7 = "layout (early_fragment_tests) in;\n\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,pcVar7,
             (allocator<char> *)
             ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count +
             7));
  std::operator+(&local_5b0,&local_5d0,&local_650);
  std::operator+(&local_590,&local_5b0,
                 "layout (location = 0) out highp vec4 o_color;\n\nprecision highp uimage2D;\n\nlayout (r32ui, binding=0) coherent uniform uimage2D u_image;\n\nvoid main (void)\n{\n\timageAtomicAdd(u_image, ivec2(0, 0), uint(1));\n\to_color = vec4(1.0);\n}\n"
                );
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_570,&local_590);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_570);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_430,(RenderContext *)this_00,pPVar13);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count +
             7));
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_610);
  glu::VertexSource::~VertexSource((VertexSource *)&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  glu::ProgramSources::~ProgramSources(&local_500);
  pFVar6 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_430);
  UniformAccessLogger::UniformAccessLogger((UniformAccessLogger *)local_6a0,pFVar6,log_00,dVar2);
  glu::operator<<(log_00,(ShaderProgram *)local_430);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_430);
  if (bVar1) {
    dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_430);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)&rnd.m_rnd.z,dVar2);
    local_700 = local_6f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"a_position",&local_721)
    ;
    glu::va::Float((VertexArrayBinding *)local_6f8,&local_720,3,4,0,iterate::vertexPositions);
    std::__cxx11::string::~string((string *)&local_720);
    std::allocator<char>::~allocator(&local_721);
    glu::CallLogWrapper::glViewport((CallLogWrapper *)&rnd.m_rnd.z,local_8c0,local_8d0,0x20,0x20);
    dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_430);
    glu::pr::Triangles((PrimitiveList *)&rendered.m_pixels.m_cap,6,iterate::indices);
    glu::draw((RenderContext *)this_00,dVar2,1,(VertexArrayBinding *)local_6f8,
              (PrimitiveList *)&rendered.m_pixels.m_cap,(DrawUtilCallback *)0x0);
    lVar10 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar2 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar2,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xc2b);
    local_a38 = (VertexArrayBinding *)&attrBindings[0].pointer.data;
    do {
      local_a38 = local_a38 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_a38);
    } while (local_a38 != (VertexArrayBinding *)local_6f8);
    attrBindings[0].pointer.data._4_4_ = 0;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
    this_local._4_4_ = STOP;
    attrBindings[0].pointer.data._4_4_ = 1;
  }
  UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)local_6a0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_430);
  std::__cxx11::string::~string((string *)local_358);
  if (attrBindings[0].pointer.data._4_4_ == 0) {
    tcu::Surface::Surface((Surface *)local_758,0x20,0x20);
    tcu::Surface::getAccess(&local_780,(Surface *)local_758);
    glu::readPixels((RenderContext *)this_00,local_8c0,local_8d0,&local_780);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"Rendered",&local_831);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numSamples,"Rendered image",
               (allocator<char> *)((long)&expectedCounter + 3));
    tcu::LogImage::LogImage
              (&local_810,&local_830,(string *)&numSamples,(Surface *)local_758,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(log_00,&local_810);
    tcu::LogImage::~LogImage(&local_810);
    std::__cxx11::string::~string((string *)&numSamples);
    std::allocator<char>::~allocator((allocator<char> *)((long)&expectedCounter + 3));
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator(&local_831);
    tcu::Surface::~Surface((Surface *)local_758);
    pRVar8 = (RenderTarget *)(**(code **)(*(long *)this_00 + 0x20))();
    iVar3 = tcu::RenderTarget::getNumSamples(pRVar8);
    tolerance = de::max<int>(1,iVar3);
    expectedMin = 0x400;
    if (bVar14) {
      expectedMin = 0x200;
      local_a80 = de::max<int>(0x20,0x20);
      local_a80 = local_a80 * 3;
    }
    else {
      local_a80 = 0;
    }
    expectedMax = local_a80;
    local_86c = de::max<int>(0,expectedMin - local_a80);
    local_870 = (expectedMin + expectedMax) * tolerance;
    dVar2 = glu::ObjectWrapper::operator*
                      ((ObjectWrapper *)
                       &fbo.
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.field_0x8);
    tcu::TextureFormat::TextureFormat(&local_878,R,UNSIGNED_INT32);
    tcu::Vector<int,_3>::Vector(&local_884,1,1,1);
    R32UIImageSingleValueVerifier::R32UIImageSingleValueVerifier(&local_898,local_86c,local_870);
    bVar14 = readIntegerTextureViaFBOAndVerify
                       ((RenderContext *)this_00,(CallLogWrapper *)&rnd.m_rnd.z,dVar2,TEXTURETYPE_2D
                        ,&local_878,&local_884,&local_898.super_ImageLayerVerifier);
    R32UIImageSingleValueVerifier::~R32UIImageSingleValueVerifier(&local_898);
    if (bVar14) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got wrong value");
    }
    this_local._4_4_ = STOP;
    attrBindings[0].pointer.data._4_4_ = 1;
  }
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
              *)local_b8);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
              *)&testAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.field_0x8);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              *)&colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.field_0x8);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &fbo.
              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              .m_data.field_0x8);
  de::Random::~Random((Random *)local_50);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&rnd.m_rnd.z);
  return this_local._4_4_;
}

Assistant:

EarlyFragmentTestsCase::IterateResult EarlyFragmentTestsCase::iterate (void)
{
	const RenderContext&			renderCtx			= m_context.getRenderContext();
	TestLog&						log					(m_testCtx.getLog());
	glu::CallLogWrapper				glLog				(renderCtx.getFunctions(), log);
	de::Random						rnd					(deStringHash(getName()));
	const bool						expectPartialResult	= m_useEarlyTests && m_renderTarget != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT;
	const int						viewportWidth		= RENDER_SIZE;
	const int						viewportHeight		= RENDER_SIZE;
	const int						viewportX			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getWidth() - viewportWidth))	: (0);
	const int						viewportY			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getHeight() - viewportHeight))	: (0);
	const glu::Texture				texture				(renderCtx);
	de::MovePtr<glu::Framebuffer>	fbo;
	de::MovePtr<glu::Renderbuffer>	colorAttachment;
	de::MovePtr<glu::Renderbuffer>	testAttachment;

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(GL_TEXTURE_2D, *texture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	{
		LayeredImage src(TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32), 1, 1, 1);
		src.setPixel(0, 0, 0, IVec4(0));
		uploadTexture(glLog, src, 0 /* always 2d texture, no buffer needed */);
	}
	glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Set up framebuffer
	if (m_renderTarget == RENDERTARGET_FBO ||
		m_renderTarget == RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT)
	{
		fbo				= de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
		colorAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
		testAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));

		glLog.glBindRenderbuffer(GL_RENDERBUFFER, **colorAttachment);
		glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen color attachment rb");

		glLog.glBindFramebuffer(GL_FRAMEBUFFER, **fbo);
		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo color attachment");

		if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_DEPTH)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen depth attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo depth attachment");
		}
		else if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_STENCIL)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen stencil attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo stencil attachment");
		}

		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "setup fbo");
		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	// Set up appropriate conditions for the test.

	glLog.glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
	glLog.glClear(GL_COLOR_BUFFER_BIT);

	if (m_type == TESTTYPE_DEPTH)
	{
		glLog.glClearDepthf(0.5f);
		glLog.glClear(GL_DEPTH_BUFFER_BIT);
		glLog.glEnable(GL_DEPTH_TEST);
	}
	else if (m_type == TESTTYPE_STENCIL)
	{
		glLog.glClearStencil(0);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glScissor(viewportX, viewportY, viewportWidth/2, viewportHeight);
		glLog.glEnable(GL_SCISSOR_TEST);
		glLog.glClearStencil(1);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glDisable(GL_SCISSOR_TEST);
		glLog.glStencilFunc(GL_EQUAL, 1, 1);
		glLog.glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
		glLog.glEnable(GL_STENCIL_TEST);
	}
	else
		DE_ASSERT(false);

	// Perform image stores in fragment shader.

	{
		const std::string glslVersionDeclaration = glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		// Generate fragment shader.

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::VertexSource(		glslVersionDeclaration + "\n"
															"\n"
															"highp in vec3 a_position;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	gl_Position = vec4(a_position, 1.0);\n"
															"}\n")

								  << glu::FragmentSource(	glslVersionDeclaration + "\n"
															+ imageAtomicExtensionShaderRequires(renderCtx) +
															"\n"
															+ string(m_useEarlyTests ? "layout (early_fragment_tests) in;\n\n" : "") +
															"layout (location = 0) out highp vec4 o_color;\n"
															"\n"
															"precision highp uimage2D;\n"
															"\n"
															"layout (r32ui, binding=0) coherent uniform uimage2D u_image;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	imageAtomicAdd(u_image, ivec2(0, 0), uint(1));\n"
															"	o_color = vec4(1.0);\n"
															"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and draw full-viewport quad.

		glLog.glUseProgram(program.getProgram());

		{
			static const float vertexPositions[4*3] =
			{
				-1.0, -1.0, -1.0f,
				 1.0, -1.0,  0.0f,
				-1.0,  1.0,  0.0f,
				 1.0,  1.0,  1.0f,
			};

			static const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("a_position", 3, 4, 0, &vertexPositions[0])
			};

			glLog.glViewport(viewportX, viewportY, viewportWidth, viewportHeight);

			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Draw failed");
		}
	}

	// Log rendered result for convenience.
	{
		tcu::Surface rendered(viewportWidth, viewportHeight);
		glu::readPixels(renderCtx, viewportX, viewportY, rendered.getAccess());
		log << TestLog::Image("Rendered", "Rendered image", rendered);
	}

	// Read counter value and check.
	{
		const int numSamples		= de::max(1, renderCtx.getRenderTarget().getNumSamples());
		const int expectedCounter	= expectPartialResult ? viewportWidth*viewportHeight/2				: viewportWidth*viewportHeight;
		const int tolerance			= expectPartialResult ? de::max(viewportWidth, viewportHeight)*3	: 0;
		const int expectedMin		= de::max(0, expectedCounter - tolerance);
		const int expectedMax		= (expectedCounter + tolerance) * numSamples;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *texture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(expectedMin, expectedMax)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}